

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_filename.c
# Opt level: O0

wchar_t file_open(archive_conflict *a,void *client_data)

{
  wchar_t wVar1;
  int iVar2;
  int *piVar3;
  char *local_d0;
  char *mbs;
  wchar_t *wcs;
  stat st;
  write_file_data *mine;
  wchar_t flags;
  void *client_data_local;
  archive_conflict *a_local;
  
  local_d0 = (char *)0x0;
  mbs = (char *)0x0;
  st.__glibc_reserved[2] = (__syscall_slong_t)client_data;
  wVar1 = archive_mstring_get_mbs(a,(archive_mstring *)((long)client_data + 8),&local_d0);
  if (wVar1 == L'\0') {
    iVar2 = open(local_d0,0x80241,0x1b6);
    *(int *)st.__glibc_reserved[2] = iVar2;
    __archive_ensure_cloexec_flag(*(int *)st.__glibc_reserved[2]);
    if (*(int *)st.__glibc_reserved[2] < 0) {
      if (local_d0 == (char *)0x0) {
        piVar3 = __errno_location();
        archive_set_error((archive *)a,*piVar3,"Failed to open \'%ls\'",mbs);
      }
      else {
        piVar3 = __errno_location();
        archive_set_error((archive *)a,*piVar3,"Failed to open \'%s\'",local_d0);
      }
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      iVar2 = fstat(*(int *)st.__glibc_reserved[2],(stat *)&wcs);
      if (iVar2 == 0) {
        iVar2 = archive_write_get_bytes_in_last_block((archive *)a);
        if (iVar2 < 0) {
          if (((((uint)st.st_nlink & 0xf000) == 0x2000) || (((uint)st.st_nlink & 0xf000) == 0x6000))
             || (((uint)st.st_nlink & 0xf000) == 0x1000)) {
            archive_write_set_bytes_in_last_block((archive *)a,0);
          }
          else {
            archive_write_set_bytes_in_last_block((archive *)a,1);
          }
        }
        if (((uint)st.st_nlink & 0xf000) == 0x8000) {
          archive_write_set_skip_file((archive *)a,(la_int64_t)wcs,st.st_dev);
        }
        a_local._4_4_ = L'\0';
      }
      else {
        if (local_d0 == (char *)0x0) {
          piVar3 = __errno_location();
          archive_set_error((archive *)a,*piVar3,"Couldn\'t stat \'%ls\'",mbs);
        }
        else {
          piVar3 = __errno_location();
          archive_set_error((archive *)a,*piVar3,"Couldn\'t stat \'%s\'",local_d0);
        }
        a_local._4_4_ = L'\xffffffe2';
      }
    }
  }
  else {
    piVar3 = __errno_location();
    if (*piVar3 == 0xc) {
      piVar3 = __errno_location();
      archive_set_error((archive *)a,*piVar3,"No memory");
    }
    else {
      archive_mstring_get_wcs(a,(archive_mstring *)(st.__glibc_reserved[2] + 8),(wchar_t **)&mbs);
      piVar3 = __errno_location();
      archive_set_error((archive *)a,*piVar3,"Can\'t convert \'%ls\' to MBS",mbs);
    }
    a_local._4_4_ = L'\xffffffe2';
  }
  return a_local._4_4_;
}

Assistant:

static int
file_open(struct archive *a, void *client_data)
{
	int flags;
	struct write_file_data *mine;
	struct stat st;
#if defined(_WIN32) && !defined(__CYGWIN__)
	wchar_t *fullpath;
#endif
	const wchar_t *wcs;
	const char *mbs;

	mine = (struct write_file_data *)client_data;
	flags = O_WRONLY | O_CREAT | O_TRUNC | O_BINARY | O_CLOEXEC;

	/*
	 * Open the file.
	 */
	mbs = NULL; wcs = NULL;
#if defined(_WIN32) && !defined(__CYGWIN__)
	if (archive_mstring_get_wcs(a, &mine->filename, &wcs) != 0) {
		if (errno == ENOMEM)
			archive_set_error(a, errno, "No memory");
		else {
			archive_mstring_get_mbs(a, &mine->filename, &mbs);
			archive_set_error(a, errno,
			    "Can't convert '%s' to WCS", mbs);
		}
		return (ARCHIVE_FATAL);
	}
	fullpath = __la_win_permissive_name_w(wcs);
	if (fullpath != NULL) {
		mine->fd = _wopen(fullpath, flags, 0666);
		free(fullpath);
	} else
		mine->fd = _wopen(wcs, flags, 0666);
#else
	if (archive_mstring_get_mbs(a, &mine->filename, &mbs) != 0) {
		if (errno == ENOMEM)
			archive_set_error(a, errno, "No memory");
		else {
			archive_mstring_get_wcs(a, &mine->filename, &wcs);
			archive_set_error(a, errno,
			    "Can't convert '%ls' to MBS", wcs);
		}
		return (ARCHIVE_FATAL);
	}
	mine->fd = open(mbs, flags, 0666);
	__archive_ensure_cloexec_flag(mine->fd);
#endif
	if (mine->fd < 0) {
		if (mbs != NULL)
			archive_set_error(a, errno, "Failed to open '%s'", mbs);
		else
			archive_set_error(a, errno, "Failed to open '%ls'", wcs);
		return (ARCHIVE_FATAL);
	}

	if (fstat(mine->fd, &st) != 0) {
		if (mbs != NULL)
			archive_set_error(a, errno, "Couldn't stat '%s'", mbs);
		else
			archive_set_error(a, errno, "Couldn't stat '%ls'", wcs);
		return (ARCHIVE_FATAL);
	}

	/*
	 * Set up default last block handling.
	 */
	if (archive_write_get_bytes_in_last_block(a) < 0) {
		if (S_ISCHR(st.st_mode) || S_ISBLK(st.st_mode) ||
		    S_ISFIFO(st.st_mode))
			/* Pad last block when writing to device or FIFO. */
			archive_write_set_bytes_in_last_block(a, 0);
		else
			/* Don't pad last block otherwise. */
			archive_write_set_bytes_in_last_block(a, 1);
	}

	/*
	 * If the output file is a regular file, don't add it to
	 * itself.  If it's a device file, it's okay to add the device
	 * entry to the output archive.
	 */
	if (S_ISREG(st.st_mode))
		archive_write_set_skip_file(a, st.st_dev, st.st_ino);

	return (ARCHIVE_OK);
}